

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::ConvertCursorMove(CUI *this,float *pX,float *pY,int CursorType)

{
  CConfig *pCVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  CUI *in_RDI;
  float Factor;
  float local_20;
  
  local_20 = 1.0;
  if (in_ECX == 1) {
    pCVar1 = Config(in_RDI);
    local_20 = (float)pCVar1->m_UiMousesens / 100.0;
  }
  else if (in_ECX == 2) {
    pCVar1 = Config(in_RDI);
    local_20 = (float)pCVar1->m_UiJoystickSens / 100.0;
  }
  *in_RSI = local_20 * *in_RSI;
  *in_RDX = local_20 * *in_RDX;
  return;
}

Assistant:

void CUI::ConvertCursorMove(float *pX, float *pY, int CursorType) const
{
	float Factor = 1.0f;
	switch(CursorType)
	{
		case IInput::CURSOR_MOUSE:
			Factor = Config()->m_UiMousesens/100.0f;
			break;
		case IInput::CURSOR_JOYSTICK:
			Factor = Config()->m_UiJoystickSens/100.0f;
			break;
	}
	*pX *= Factor;
	*pY *= Factor;
}